

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Teleport_NewMap(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                      int arg4)

{
  bool bVar1;
  level_info_t *info_00;
  char *levelname;
  level_info_t *info;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  if ((((backSide) && (gameinfo.gametype != GAME_Strife)) ||
      (info_00 = FindLevelByNum(arg0), info_00 == (level_info_t *)0x0)) ||
     (bVar1 = CheckIfExitIsGood(it,info_00), !bVar1)) {
    ln_local._4_4_ = 0;
  }
  else {
    levelname = FString::operator_cast_to_char_(&info_00->MapName);
    G_ChangeLevel(levelname,arg1,(uint)(arg2 != 0),-1);
    ln_local._4_4_ = 1;
  }
  return ln_local._4_4_;
}

Assistant:

FUNC(LS_Teleport_NewMap)
// Teleport_NewMap (map, position, keepFacing?)
{
	if (backSide == 0 || gameinfo.gametype == GAME_Strife)
	{
		level_info_t *info = FindLevelByNum (arg0);

		if (info && CheckIfExitIsGood (it, info))
		{
			G_ChangeLevel(info->MapName, arg1, arg2 ? CHANGELEVEL_KEEPFACING : 0);
			return true;
		}
	}
	return false;
}